

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

char * getSelectionString(Atom selection)

{
  long *plVar1;
  long lVar2;
  Atom AVar3;
  int iVar4;
  Window WVar5;
  char *pcVar6;
  char *pcVar7;
  unsigned_long uVar8;
  size_t __size;
  long lVar9;
  bool bVar10;
  undefined1 local_218 [8];
  XEvent dummy;
  XEvent notification;
  Atom targets [2];
  undefined1 local_80 [8];
  unsigned_long bytesAfter;
  Atom local_70;
  Atom local_68;
  Atom actualType;
  unsigned_long itemCount;
  long local_50;
  undefined1 local_44 [4];
  char *pcStack_40;
  int actualFormat;
  char *local_38;
  char *data;
  
  notification.pad[0x17] = _glfw.x11.UTF8_STRING;
  targets[0] = 0x1f;
  bVar10 = _glfw.x11.PRIMARY != selection;
  local_70 = selection;
  WVar5 = XGetSelectionOwner(_glfw.x11.display);
  pcVar6 = *(char **)((long)_glfw.x11.keynames + (ulong)bVar10 * 8 + -0x10);
  if (WVar5 != _glfw.x11.helperWindowHandle) {
    lVar2 = (ulong)bVar10 * 8;
    lVar9 = lVar2 + 0x1ff08;
    free(pcVar6);
    *(undefined8 *)((long)_glfw.x11.keynames + lVar2 + -0x10) = 0;
    plVar1 = dummy.pad + 0x17;
    local_50 = lVar9;
    uVar8 = 0;
    while (uVar8 != 2) {
      bytesAfter = uVar8;
      itemCount = targets[uVar8 - 1];
      XConvertSelection(_glfw.x11.display,local_70,itemCount,_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar4 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,plVar1),
            iVar4 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.subwindow != 0) {
        XCheckIfEvent(_glfw.x11.display,local_218,isSelPropNewValueNotify,plVar1);
        XGetWindowProperty(_glfw.x11.display,notification.xany.display,notification.xkey.subwindow,0
                           ,0x7fffffffffffffff,1,0,&local_68,local_44,&actualType,local_80,&local_38
                          );
        if (local_68 == _glfw.x11.INCR) {
          __size = 1;
          pcStack_40 = (char *)0x0;
          while( true ) {
            while (iVar4 = XCheckIfEvent(_glfw.x11.display,local_218,isSelPropNewValueNotify,plVar1)
                  , iVar4 == 0) {
              waitForEvent((double *)0x0);
            }
            XFree(local_38);
            XGetWindowProperty(_glfw.x11.display,notification.xany.display,
                               notification.xkey.subwindow,0,0x7fffffffffffffff,1,0,&local_68,
                               local_44,&actualType,local_80,&local_38);
            pcVar6 = pcStack_40;
            AVar3 = actualType;
            if (actualType == 0) break;
            __size = __size + actualType;
            pcStack_40 = (char *)realloc(pcStack_40,__size);
            pcStack_40[~AVar3 + __size] = '\0';
            strcat(pcStack_40,local_38);
          }
          lVar9 = local_50;
          if (itemCount == 0x1f) {
            pcVar7 = convertLatin1toUTF8(pcStack_40);
            lVar9 = local_50;
            *(char **)((long)&_glfw.initialized + local_50) = pcVar7;
            free(pcVar6);
          }
          else {
LAB_0013723d:
            *(char **)((long)&_glfw.initialized + lVar9) = pcVar6;
          }
        }
        else if (local_68 == itemCount) {
          if (itemCount == 0x1f) {
            pcVar6 = convertLatin1toUTF8(local_38);
          }
          else {
            pcVar6 = _glfw_strdup(local_38);
          }
          goto LAB_0013723d;
        }
        XFree(local_38);
        pcVar6 = *(char **)((long)&_glfw.initialized + lVar9);
        if (pcVar6 != (char *)0x0) {
          return pcVar6;
        }
      }
      uVar8 = bytesAfter + 1;
    }
    pcVar6 = *(char **)((long)&_glfw.initialized + lVar9);
    if (pcVar6 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar6 = *(char **)((long)&_glfw.initialized + lVar9);
    }
  }
  return pcVar6;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}